

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::LoadImportMetaObject(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R0;
  ModuleID C1;
  Symbol *this_00;
  undefined4 *puVar3;
  Symbol *importMetaSym;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  this_00 = FuncInfo::GetImportMetaSymbol(funcInfo);
  if (this_00 == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8c4,"(importMetaSym)","importMetaSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  R0 = Symbol::GetLocation(this_00);
  C1 = GetModuleID(this);
  Js::ByteCodeWriter::Reg1Unsigned1(&this->m_writer,LdImportMeta,R0,C1);
  return;
}

Assistant:

void ByteCodeGenerator::LoadImportMetaObject(FuncInfo* funcInfo)
{
    Symbol* importMetaSym = funcInfo->GetImportMetaSymbol();
    Assert(importMetaSym);

    m_writer.Reg1Unsigned1(Js::OpCode::LdImportMeta, importMetaSym->GetLocation(), this->GetModuleID());
}